

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AEAD_Poly1305_64.c
# Opt level: O3

void Hacl_Impl_Poly1305_64_poly1305_last_pass(uint64_t *acc)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint64_t b0;
  ulong uVar6;
  uint64_t b2;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = *acc;
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    acc[lVar4] = uVar2 & 0xfffffffffff;
    uVar2 = (uVar2 >> 0x2c) + acc[lVar4 + 1];
    acc[lVar4 + 1] = uVar2;
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  uVar2 = (acc[2] >> 0x2a) * 5 + *acc;
  uVar7 = (uVar2 >> 0x2c) + acc[1];
  uVar8 = (uVar7 >> 0x2c) + (acc[2] & 0x3ffffffffff);
  uVar2 = (uVar8 >> 0x2a) * 5 + (uVar2 & 0xfffffffffff);
  uVar6 = uVar2 & 0xfffffffffff;
  uVar5 = (uVar2 >> 0x2c) + (uVar7 & 0xfffffffffff);
  uVar7 = uVar5 << 0x20 & (uVar5 ^ 0xfffff00000000000);
  uVar7 = uVar7 << 0x10 & uVar7;
  uVar7 = uVar7 << 8 & uVar7;
  uVar7 = uVar7 << 4 & uVar7;
  uVar7 = uVar7 * 4 & uVar7;
  uVar9 = uVar8 << 0x20 & (uVar8 | 0xfffffc0000000000);
  uVar9 = uVar9 << 0x10 & uVar9;
  uVar9 = uVar9 << 8 & uVar9;
  uVar9 = uVar9 << 4 & uVar9;
  uVar9 = uVar9 * 4 & uVar9;
  uVar2 = 0;
  if (0xffffffffffa < uVar6) {
    uVar2 = (long)(uVar7 * 2 & uVar7) >> 0x3f;
  }
  uVar2 = (long)(uVar9 * 2 & uVar9) >> 0x3f & uVar2;
  *acc = uVar6 - (uVar2 & 0xffffffffffb);
  acc[1] = uVar5 - (uVar2 & 0xfffffffffff);
  acc[2] = (uVar8 & 0x3ffffffffff) - (uVar2 & 0x3ffffffffff);
  return;
}

Assistant:

static void Hacl_Impl_Poly1305_64_poly1305_last_pass(uint64_t *acc)
{
  Hacl_Bignum_Fproduct_carry_limb_(acc);
  Hacl_Bignum_Modulo_carry_top(acc);
  uint64_t a0 = acc[0U];
  uint64_t a10 = acc[1U];
  uint64_t a20 = acc[2U];
  uint64_t a0_ = a0 & (uint64_t)0xfffffffffffU;
  uint64_t r0 = a0 >> (uint32_t)44U;
  uint64_t a1_ = (a10 + r0) & (uint64_t)0xfffffffffffU;
  uint64_t r1 = (a10 + r0) >> (uint32_t)44U;
  uint64_t a2_ = a20 + r1;
  acc[0U] = a0_;
  acc[1U] = a1_;
  acc[2U] = a2_;
  Hacl_Bignum_Modulo_carry_top(acc);
  uint64_t i0 = acc[0U];
  uint64_t i1 = acc[1U];
  uint64_t i0_ = i0 & (uint64_t)0xfffffffffffU;
  uint64_t i1_ = i1 + (i0 >> (uint32_t)44U);
  acc[0U] = i0_;
  acc[1U] = i1_;
  uint64_t a00 = acc[0U];
  uint64_t a1 = acc[1U];
  uint64_t a2 = acc[2U];
  uint64_t mask0 = FStar_UInt64_gte_mask(a00, (uint64_t)0xffffffffffbU);
  uint64_t mask1 = FStar_UInt64_eq_mask(a1, (uint64_t)0xfffffffffffU);
  uint64_t mask2 = FStar_UInt64_eq_mask(a2, (uint64_t)0x3ffffffffffU);
  uint64_t mask = (mask0 & mask1) & mask2;
  uint64_t a0_0 = a00 - ((uint64_t)0xffffffffffbU & mask);
  uint64_t a1_0 = a1 - ((uint64_t)0xfffffffffffU & mask);
  uint64_t a2_0 = a2 - ((uint64_t)0x3ffffffffffU & mask);
  acc[0U] = a0_0;
  acc[1U] = a1_0;
  acc[2U] = a2_0;
}